

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrcmp.cpp
# Opt level: O0

unsigned_long __thiscall
CVmObjStrComp::match_strings
          (CVmObjStrComp *this,char *valstr,size_t vallen,char *refstr,size_t reflen)

{
  vmobj_strcmp_equiv *pvVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  int iVar4;
  vmobj_strcmp_ext *b;
  size_t sVar5;
  utf8_ptr *in_RCX;
  size_t *in_RDX;
  utf8_ptr *in_RSI;
  CVmObjStrComp *in_RDI;
  size_t *in_R8;
  bool bVar6;
  size_t valcharlen;
  size_t vlen;
  wchar_t *vp;
  vmobj_strcmp_equiv *eq;
  vmobj_strcmp_equiv **t1;
  wchar_t refch;
  wchar_t valch;
  int fold_case;
  unsigned_long ret;
  utf8_ptr refp;
  utf8_ptr valp;
  vmobj_strcmp_ext *ext;
  wchar_t in_stack_ffffffffffffff64;
  size_t *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 uVar7;
  size_t local_80;
  wchar_t *local_78;
  ulong local_50;
  utf8_ptr local_48;
  utf8_ptr in_stack_ffffffffffffffc0;
  ulong local_8;
  
  b = get_ext(in_RDI);
  utf8_ptr::utf8_ptr((utf8_ptr *)&stack0xffffffffffffffc0);
  utf8_ptr::utf8_ptr(&local_48);
  bVar6 = b->case_sensitive != 0;
  utf8_ptr::set((utf8_ptr *)&stack0xffffffffffffffc0,(char *)in_RSI);
  utf8_ptr::set(&local_48,(char *)in_RCX);
  local_50 = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        uVar7 = in_RDX != (size_t *)0x0 && in_R8 != (size_t *)0x0;
        if (in_RDX == (size_t *)0x0 || in_R8 == (size_t *)0x0) {
          if ((in_R8 == (size_t *)0x0) && (in_RDX == (size_t *)0x0)) {
            local_8 = local_50 | 1;
          }
          else if (in_RDX == (size_t *)0x0) {
            utf8_ptr::getptr((utf8_ptr *)&stack0xffffffffffffffc0);
            sVar5 = utf8_ptr::s_len((char *)CONCAT17(uVar7,in_stack_ffffffffffffff70),
                                    (size_t)in_stack_ffffffffffffff68);
            if ((b->trunc_len == 0) || (sVar5 < b->trunc_len)) {
              local_8 = 0;
            }
            else {
              local_8 = local_50 | 5;
            }
          }
          else {
            local_8 = 0;
          }
          return local_8;
        }
        wVar2 = utf8_ptr::getch((utf8_ptr *)0x338fcb);
        wVar3 = utf8_ptr::getch((utf8_ptr *)0x338fd9);
        if (wVar3 != wVar2) break;
        utf8_ptr::inc((utf8_ptr *)CONCAT17(uVar7,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff68);
        utf8_ptr::inc((utf8_ptr *)CONCAT17(uVar7,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff68);
      }
      if ((bVar6) || (iVar4 = t3_compare_case_fold_min(in_RSI,in_RDX,in_RCX,in_R8), iVar4 != 0))
      break;
      local_50 = local_50 | 2;
    }
    if ((b->equiv[wVar3 >> 8 & 0xff] == (vmobj_strcmp_equiv **)0x0) ||
       (pvVar1 = b->equiv[wVar3 >> 8 & 0xff][wVar3 & 0xff], pvVar1 == (vmobj_strcmp_equiv *)0x0))
    break;
    iVar4 = t3_is_upper(in_stack_ffffffffffffff64);
    if (iVar4 == 0) {
      in_stack_ffffffffffffff68 = (size_t *)pvVar1->lc_result_flags;
    }
    else {
      in_stack_ffffffffffffff68 = (size_t *)pvVar1->uc_result_flags;
    }
    local_50 = (ulong)in_stack_ffffffffffffff68 | local_50;
    local_78 = pvVar1->val_ch;
    local_80 = pvVar1->val_ch_cnt;
    while( true ) {
      wVar3 = in_stack_ffffffffffffff64 & 0xffffff;
      if (in_RDX != (size_t *)0x0) {
        wVar3 = CONCAT13(local_80 != 0,(int3)in_stack_ffffffffffffff64);
      }
      in_stack_ffffffffffffff64 = wVar3;
      if ((char)((uint)in_stack_ffffffffffffff64 >> 0x18) == '\0') break;
      if (*local_78 == wVar2) {
        utf8_ptr::inc((utf8_ptr *)CONCAT17(uVar7,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff68);
        local_78 = local_78 + 1;
        local_80 = local_80 - 1;
      }
      else {
        if ((bVar6) ||
           (iVar4 = t3_compare_case_fold_min
                              (in_RCX,in_R8,(wchar_t **)b,(size_t *)in_stack_ffffffffffffffc0.p_),
           iVar4 != 0)) {
          return 0;
        }
        local_50 = local_50 | 2;
      }
    }
    if (local_80 != 0) {
      return 0;
    }
    utf8_ptr::inc((utf8_ptr *)CONCAT17(uVar7,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68);
  }
  return 0;
}

Assistant:

unsigned long CVmObjStrComp::match_strings(const char *valstr, size_t vallen,
                                           const char *refstr, size_t reflen)
{
    vmobj_strcmp_ext *ext = get_ext();
    utf8_ptr valp;
    utf8_ptr refp;
    unsigned long ret;
    int fold_case = !(ext->case_sensitive);

    /* set up to scan the strings */
    valp.set((char *)valstr);
    refp.set((char *)refstr);

    /* start with no return flags */
    ret = 0;

    /* scan the strings */
    while (vallen != 0 && reflen != 0)
    {
        /* get each character */
        wchar_t valch = valp.getch();
        wchar_t refch = refp.getch();

        /* check for an exact match first */
        if (refch == valch)
        {
            /* it's an exact match - skip this character in each string */
            valp.inc(&vallen);
            refp.inc(&reflen);
            continue;
        }

        /* check for a case-folded match if we're insensitive to case */
        if (fold_case
            && t3_compare_case_fold_min(valp, vallen, refp, reflen) == 0)
        {
            /* note in the flags that we have differing cases in the match */
            ret |= RF_CASEFOLD;

            /* keep going */
            continue;
        }

        /* check for a reference equivalence mapping */
        vmobj_strcmp_equiv **t1;
        vmobj_strcmp_equiv *eq;
        if ((t1 = ext->equiv[(refch >> 8) & 0xFF]) != 0
            && (eq = t1[refch & 0xFF]) != 0)
        {
            /* 
             *   In case we match, apply the appropriate flags added for the
             *   equivalence mapping, based on the case of the first value
             *   character we're testing.  (If we don't match, we'll simply
             *   return failure, so it won't matter that we messed with the
             *   flags.)  
             */
            ret |= (t3_is_upper(valch)
                    ? eq->uc_result_flags
                    : eq->lc_result_flags);

            /* match each character from the mapping string */
            const wchar_t *vp;
            size_t vlen;
            for (vp = eq->val_ch, vlen = eq->val_ch_cnt ;
                 vallen != 0 && vlen != 0 ; )
            {
                /* get this character */
                refch = *vp;
                
                /* if we have an exact match, keep going */
                if (refch == valch)
                {
                    /* matched - skip this character in each string */
                    valp.inc(&vallen);
                    ++vp, --vlen;

                    /* keep going */
                    continue;
                }

                /* check for a case-folded match if appropriate */
                if (fold_case
                    && t3_compare_case_fold_min(valp, vallen, vp, vlen) == 0)
                {
                    /* note the case-folded match and keep going */
                    ret |= RF_CASEFOLD;
                    continue;
                }

                /* no match */
                return 0;
            }

            /* 
             *   if we didn't make it to the end of the equivalence string,
             *   we must have run out of source before we matched the whole
             *   string, so we don'to have a match 
             */
            if (vlen != 0)
                return 0;

            /* 
             *   If we make it here, we matched the equivalence mapping.
             *   We've already skipped the input we matched, so skip the
             *   reference character and keep going.  
             */
            refp.inc(&reflen);
            continue;
        }

        /* we don't have anything else to try, so we don't have a match */
        return 0;
    }

    /* 
     *   If we ran out of reference string before we ran out of value
     *   string, we definitely do not have a match.  If we ran out of value
     *   string before we ran out reference string, we have a match as long
     *   as we matched at least the truncation length. 
     */
    if (reflen == 0 && vallen == 0)
    {
        /* 
         *   We ran out of both at the same time - it's a match.  Return the
         *   result code up to this point OR'd with RF_MATCH, which is our
         *   pre-defined bit that we set for every match.  
         */
        return (ret | RF_MATCH);
    }
    else if (vallen != 0)
    {
        /* we ran out of reference string first - it's not a match */
        return 0;
    }
    else
    {
        /* 
         *   We ran out of value string first, so it's a truncated match if
         *   we matched at least up to the truncation length (assuming we
         *   allow truncation at all).  If we didn't make it to the
         *   truncation length, or we don't allow truncation, it's not a
         *   match. 
         */
        size_t valcharlen = utf8_ptr::s_len(valstr, valp.getptr() - valstr);
        if (ext->trunc_len != 0 && valcharlen >= ext->trunc_len)
        {
            /* 
             *   it's a truncated match - return the result code up to this
             *   point, OR'd with RF_MATCH (our pre-defined bit we set for
             *   every match) and RF_TRUNC (our pre-defined bit we set for
             *   truncated matches) 
             */
            return (ret | RF_MATCH | RF_TRUNC);
        }
        else
        {
            /* didn't make it to the truncation length, so it's not a match */
            return 0;
        }
    }
}